

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O1

JSON_Value * json_value_init_null(void)

{
  JSON_Value *pJVar1;
  
  pJVar1 = (JSON_Value *)(*parson_malloc)(0x20);
  if (pJVar1 == (JSON_Value *)0x0) {
    pJVar1 = (JSON_Value *)0x0;
  }
  else {
    pJVar1->parent = (JSON_Value *)0x0;
    pJVar1->type = 1;
  }
  return pJVar1;
}

Assistant:

JSON_Value * json_value_init_null(void) {
    JSON_Value *new_value = (JSON_Value*)parson_malloc(sizeof(JSON_Value));
    if (!new_value) {
        return NULL;
    }
    new_value->parent = NULL;
    new_value->type = JSONNull;
    return new_value;
}